

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uconv.h
# Opt level: O1

icu_std_converter<char,_1> * __thiscall
booster::locale::impl_icu::icu_std_converter<char,_1>::icu
          (icu_std_converter<char,_1> *this,char_type *vb,char_type *ve)

{
  UErrorCode UVar1;
  runtime_error *this_00;
  char *pcVar2;
  int in_ECX;
  UErrorCode err;
  uconv cvt;
  allocator local_55;
  UErrorCode local_54;
  uconv local_50;
  string local_48;
  
  uconv::uconv(&local_50,(string *)(vb + 8),*(cpcvt_type *)(vb + 0x28));
  local_54 = U_ZERO_ERROR;
  icu_70::UnicodeString::UnicodeString
            ((UnicodeString *)this,ve,in_ECX - (int)ve,local_50.cvt_,&local_54);
  UVar1 = local_54;
  if (local_54 < U_ILLEGAL_ARGUMENT_ERROR) {
    ucnv_close_70(local_50.cvt_);
    return this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x30);
  pcVar2 = (char *)u_errorName_70(UVar1);
  ::std::__cxx11::string::string((string *)&local_48,pcVar2,&local_55);
  runtime_error::runtime_error(this_00,&local_48);
  __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

icu::UnicodeString icu(char_type const *vb,char_type const *ve) const
        {
            char const *begin=reinterpret_cast<char const *>(vb);
            char const *end=reinterpret_cast<char const *>(ve);
            uconv cvt(charset_,cvt_type_);
            UErrorCode err=U_ZERO_ERROR;
            icu::UnicodeString tmp(begin,end-begin,cvt.cvt(),err);
            check_and_throw_icu_error(err);
            return tmp;
        }